

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::BOITestInst<false>::Exec
          (BOITestInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool bVar1;
  
  if (*inputOffset == 0) {
    *instPointer = *instPointer + 1;
    bVar1 = false;
  }
  else {
    bVar1 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return bVar1;
}

Assistant:

inline bool BOITestInst<canHardFail>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (inputOffset > 0)
        {
            if (canHardFail)
            {
                // Clearly trying to start from later in the input won't help, and we know backtracking can't take us earlier in the input
                return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
            }
            else
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }
        }
        instPointer += sizeof(*this);
        return false;
    }